

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int16_t iVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint uVar13;
  ushort uVar14;
  parasail_result_t *ppVar15;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  int16_t *piVar24;
  char *pcVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  short sVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  undefined4 uVar34;
  char *__format;
  uint uVar35;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  ushort uVar40;
  int iVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  long lVar45;
  short sVar46;
  uint uVar47;
  int16_t iVar48;
  undefined2 uVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  ulong local_4a8;
  ulong local_4a0;
  ulong local_460;
  ulong local_458;
  int16_t *local_450;
  long local_410;
  ulong local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  ulong local_398;
  ulong local_390;
  undefined1 local_380 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  short local_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short sStack_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short sStack_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  short local_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short sStack_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short sStack_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  undefined2 local_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  int iVar36;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "_s2";
LAB_0075b931:
    fprintf(_stderr,__format,"parasail_sg_flags_table_diag_avx2_256_16",pcVar25);
    return (parasail_result_t *)0x0;
  }
  uVar44 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar25 = "s2Len";
    goto LAB_0075b931;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar25 = "open";
    goto LAB_0075b931;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar25 = "gap";
    goto LAB_0075b931;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "matrix";
    goto LAB_0075b931;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "_s1";
      goto LAB_0075b931;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar25 = "_s1Len";
      goto LAB_0075b931;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  uVar29 = s2Len + 0xf;
  iVar31 = -open;
  iVar41 = matrix->min;
  iVar36 = -iVar41;
  if (iVar41 != iVar31 && SBORROW4(iVar41,iVar31) == iVar41 + open < 0) {
    iVar36 = open;
  }
  uVar35 = iVar36 - 0x7fff;
  sVar30 = 0x7ffe - (short)matrix->max;
  iVar48 = (int16_t)uVar35;
  local_2a0 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  local_1c0 = local_2a0;
  if (s1_beg == 0) {
    local_1c0._0_2_ = (undefined2)(gap << 4);
    local_1c0._2_2_ = local_1c0._0_2_;
    local_1c0._4_2_ = local_1c0._0_2_;
    local_1c0._6_2_ = local_1c0._0_2_;
    local_1c0._8_2_ = local_1c0._0_2_;
    local_1c0._10_2_ = local_1c0._0_2_;
    local_1c0._12_2_ = local_1c0._0_2_;
    local_1c0._14_2_ = local_1c0._0_2_;
    local_1c0._16_2_ = local_1c0._0_2_;
    local_1c0._18_2_ = local_1c0._0_2_;
    local_1c0._20_2_ = local_1c0._0_2_;
    local_1c0._22_2_ = local_1c0._0_2_;
    local_1c0._24_2_ = local_1c0._0_2_;
    local_1c0._26_2_ = local_1c0._0_2_;
    local_1c0._28_2_ = local_1c0._0_2_;
    local_1c0._30_2_ = local_1c0._0_2_;
  }
  local_200._0_8_ = CONCAT26(iVar48,CONCAT24(iVar48,CONCAT22(iVar48,iVar48)));
  local_200._8_8_ = CONCAT26(iVar48,CONCAT24(iVar48,CONCAT22(iVar48,iVar48)));
  local_200._16_8_ = CONCAT26(iVar48,CONCAT24(iVar48,CONCAT22(iVar48,iVar48)));
  local_200._24_8_ = CONCAT26(iVar48,CONCAT24(iVar48,CONCAT22(iVar48,iVar48)));
  local_220._8_8_ = local_200._8_8_;
  local_220._0_8_ = local_200._0_8_;
  local_220._16_8_ = local_200._16_8_;
  local_220._24_8_ = local_200._24_8_;
  local_1a0._8_8_ = local_200._8_8_;
  local_1a0._0_8_ = local_200._0_8_;
  local_1a0._16_8_ = local_200._16_8_;
  local_1a0._24_8_ = local_200._24_8_;
  local_240._8_8_ = local_200._8_8_;
  local_240._0_8_ = local_200._0_8_;
  local_240._16_8_ = local_200._16_8_;
  local_240._24_8_ = local_200._24_8_;
  auVar61._0_2_ = (short)iVar31;
  if (s1_beg == 0) {
    auVar50._4_4_ = gap;
    auVar50._0_4_ = gap;
    auVar50._8_4_ = gap;
    auVar50._12_4_ = gap;
    auVar50._16_4_ = gap;
    auVar50._20_4_ = gap;
    auVar50._24_4_ = gap;
    auVar50._28_4_ = gap;
    auVar50 = vpmulld_avx2(auVar50,_DAT_008a5ca0);
    iVar41 = gap * 0xfff7;
    auVar51._4_4_ = iVar41;
    auVar51._0_4_ = iVar41;
    auVar51._8_4_ = iVar41;
    auVar51._12_4_ = iVar41;
    auVar51._16_4_ = iVar41;
    auVar51._20_4_ = iVar41;
    auVar51._24_4_ = iVar41;
    auVar51._28_4_ = iVar41;
    auVar50 = vpblendd_avx2(auVar50,auVar51,0x40);
    auVar52._4_4_ = iVar31;
    auVar52._0_4_ = iVar31;
    auVar52._8_4_ = iVar31;
    auVar52._12_4_ = iVar31;
    auVar52._16_4_ = iVar31;
    auVar52._20_4_ = iVar31;
    auVar52._24_4_ = iVar31;
    auVar52._28_4_ = iVar31;
    auVar51 = vpblendd_avx2(auVar50,auVar52,0x80);
    auVar66 = vpinsrd_avx(ZEXT416((uint)open),gap * 8,1);
    auVar50 = vpmovsxbd_avx2(ZEXT816(0x100000000000000));
    auVar50 = vpermd_avx2(auVar50,ZEXT1632(auVar66));
    auVar50 = vpsubd_avx2(auVar51,auVar50);
    auVar50 = vpshufb_avx2(auVar50,_DAT_008a5bc0);
    auVar51 = vpermq_avx2(auVar50,0xe8);
    auVar53._0_2_ = (undefined2)(gap * 0xfff9 - open);
    auVar53._2_2_ = auVar53._0_2_;
    auVar53._4_2_ = auVar53._0_2_;
    auVar53._6_2_ = auVar53._0_2_;
    auVar53._8_2_ = auVar53._0_2_;
    auVar53._10_2_ = auVar53._0_2_;
    auVar53._12_2_ = auVar53._0_2_;
    auVar53._14_2_ = auVar53._0_2_;
    auVar53._16_2_ = auVar53._0_2_;
    auVar53._18_2_ = auVar53._0_2_;
    auVar53._20_2_ = auVar53._0_2_;
    auVar53._22_2_ = auVar53._0_2_;
    auVar53._24_2_ = auVar53._0_2_;
    auVar53._26_2_ = auVar53._0_2_;
    auVar53._28_2_ = auVar53._0_2_;
    auVar53._30_2_ = auVar53._0_2_;
    auVar68._0_2_ = (undefined2)(gap * 0xfffa - open);
    auVar68._2_2_ = auVar68._0_2_;
    auVar68._4_2_ = auVar68._0_2_;
    auVar68._6_2_ = auVar68._0_2_;
    auVar68._8_2_ = auVar68._0_2_;
    auVar68._10_2_ = auVar68._0_2_;
    auVar68._12_2_ = auVar68._0_2_;
    auVar68._14_2_ = auVar68._0_2_;
    auVar68._16_2_ = auVar68._0_2_;
    auVar68._18_2_ = auVar68._0_2_;
    auVar68._20_2_ = auVar68._0_2_;
    auVar68._22_2_ = auVar68._0_2_;
    auVar68._24_2_ = auVar68._0_2_;
    auVar68._26_2_ = auVar68._0_2_;
    auVar68._28_2_ = auVar68._0_2_;
    auVar68._30_2_ = auVar68._0_2_;
    auVar50 = vpblendw_avx2(auVar53,auVar68,2);
    auVar56._0_2_ = (undefined2)(gap * 0xfffb - open);
    auVar56._2_2_ = auVar56._0_2_;
    auVar56._4_2_ = auVar56._0_2_;
    auVar56._6_2_ = auVar56._0_2_;
    auVar56._8_2_ = auVar56._0_2_;
    auVar56._10_2_ = auVar56._0_2_;
    auVar56._12_2_ = auVar56._0_2_;
    auVar56._14_2_ = auVar56._0_2_;
    auVar56._16_2_ = auVar56._0_2_;
    auVar56._18_2_ = auVar56._0_2_;
    auVar56._20_2_ = auVar56._0_2_;
    auVar56._22_2_ = auVar56._0_2_;
    auVar56._24_2_ = auVar56._0_2_;
    auVar56._26_2_ = auVar56._0_2_;
    auVar56._28_2_ = auVar56._0_2_;
    auVar56._30_2_ = auVar56._0_2_;
    auVar50 = vpblendw_avx2(auVar50,auVar56,4);
    auVar57._0_2_ = (undefined2)(iVar31 + gap * -4);
    auVar57._2_2_ = auVar57._0_2_;
    auVar57._4_2_ = auVar57._0_2_;
    auVar57._6_2_ = auVar57._0_2_;
    auVar57._8_2_ = auVar57._0_2_;
    auVar57._10_2_ = auVar57._0_2_;
    auVar57._12_2_ = auVar57._0_2_;
    auVar57._14_2_ = auVar57._0_2_;
    auVar57._16_2_ = auVar57._0_2_;
    auVar57._18_2_ = auVar57._0_2_;
    auVar57._20_2_ = auVar57._0_2_;
    auVar57._22_2_ = auVar57._0_2_;
    auVar57._24_2_ = auVar57._0_2_;
    auVar57._26_2_ = auVar57._0_2_;
    auVar57._28_2_ = auVar57._0_2_;
    auVar57._30_2_ = auVar57._0_2_;
    auVar50 = vpblendw_avx2(auVar50,auVar57,8);
    auVar58._0_2_ = (undefined2)(gap * 0xfffd - open);
    auVar58._2_2_ = auVar58._0_2_;
    auVar58._4_2_ = auVar58._0_2_;
    auVar58._6_2_ = auVar58._0_2_;
    auVar58._8_2_ = auVar58._0_2_;
    auVar58._10_2_ = auVar58._0_2_;
    auVar58._12_2_ = auVar58._0_2_;
    auVar58._14_2_ = auVar58._0_2_;
    auVar58._16_2_ = auVar58._0_2_;
    auVar58._18_2_ = auVar58._0_2_;
    auVar58._20_2_ = auVar58._0_2_;
    auVar58._22_2_ = auVar58._0_2_;
    auVar58._24_2_ = auVar58._0_2_;
    auVar58._26_2_ = auVar58._0_2_;
    auVar58._28_2_ = auVar58._0_2_;
    auVar58._30_2_ = auVar58._0_2_;
    auVar50 = vpblendw_avx2(auVar50,auVar58,0x10);
    auVar59._0_2_ = (undefined2)(iVar31 + gap * -2);
    auVar59._2_2_ = auVar59._0_2_;
    auVar59._4_2_ = auVar59._0_2_;
    auVar59._6_2_ = auVar59._0_2_;
    auVar59._8_2_ = auVar59._0_2_;
    auVar59._10_2_ = auVar59._0_2_;
    auVar59._12_2_ = auVar59._0_2_;
    auVar59._14_2_ = auVar59._0_2_;
    auVar59._16_2_ = auVar59._0_2_;
    auVar59._18_2_ = auVar59._0_2_;
    auVar59._20_2_ = auVar59._0_2_;
    auVar59._22_2_ = auVar59._0_2_;
    auVar59._24_2_ = auVar59._0_2_;
    auVar59._26_2_ = auVar59._0_2_;
    auVar59._28_2_ = auVar59._0_2_;
    auVar59._30_2_ = auVar59._0_2_;
    auVar50 = vpblendw_avx2(auVar50,auVar59,0x20);
    auVar60._0_2_ = (undefined2)(iVar31 - gap);
    auVar60._2_2_ = auVar60._0_2_;
    auVar60._4_2_ = auVar60._0_2_;
    auVar60._6_2_ = auVar60._0_2_;
    auVar60._8_2_ = auVar60._0_2_;
    auVar60._10_2_ = auVar60._0_2_;
    auVar60._12_2_ = auVar60._0_2_;
    auVar60._14_2_ = auVar60._0_2_;
    auVar60._16_2_ = auVar60._0_2_;
    auVar60._18_2_ = auVar60._0_2_;
    auVar60._20_2_ = auVar60._0_2_;
    auVar60._22_2_ = auVar60._0_2_;
    auVar60._24_2_ = auVar60._0_2_;
    auVar60._26_2_ = auVar60._0_2_;
    auVar60._28_2_ = auVar60._0_2_;
    auVar60._30_2_ = auVar60._0_2_;
    auVar50 = vpblendw_avx2(auVar50,auVar60,0x40);
    auVar61._2_2_ = auVar61._0_2_;
    auVar61._4_2_ = auVar61._0_2_;
    auVar61._6_2_ = auVar61._0_2_;
    auVar61._8_2_ = auVar61._0_2_;
    auVar61._10_2_ = auVar61._0_2_;
    auVar61._12_2_ = auVar61._0_2_;
    auVar61._14_2_ = auVar61._0_2_;
    auVar61._16_2_ = auVar61._0_2_;
    auVar61._18_2_ = auVar61._0_2_;
    auVar61._20_2_ = auVar61._0_2_;
    auVar61._22_2_ = auVar61._0_2_;
    auVar61._24_2_ = auVar61._0_2_;
    auVar61._26_2_ = auVar61._0_2_;
    auVar61._28_2_ = auVar61._0_2_;
    auVar61._30_2_ = auVar61._0_2_;
    auVar50 = vpblendw_avx2(auVar50,auVar61,0x80);
    local_2a0 = vpblendd_avx2(auVar51,auVar50,0xf0);
  }
  ppVar15 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar15 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar15->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar15->flag | 0x10221002;
  uVar28 = (ulong)(s2Len + 0x1e);
  ptr = parasail_memalign_int16_t(0x20,uVar28);
  ptr_00 = parasail_memalign_int16_t(0x20,uVar28);
  ptr_01 = parasail_memalign_int16_t(0x20,uVar28);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (int16_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  lVar45 = (long)_s1Len;
  if (matrix->type == 0) {
    local_450 = parasail_memalign_int16_t(0x20,(long)(int)(_s1Len + 0xf));
    if (local_450 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    for (uVar28 = 0; lVar23 = lVar45, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar28;
        uVar28 = uVar28 + 1) {
      local_450[uVar28] = (int16_t)matrix->mapper[(byte)_s1[uVar28]];
    }
    for (; lVar23 < (int)(_s1Len + 0xf); lVar23 = lVar23 + 1) {
      local_450[lVar23] = 0;
    }
  }
  else {
    local_450 = (int16_t *)0x0;
  }
  uVar49 = (undefined2)_s1Len;
  local_c0._2_2_ = uVar49;
  local_c0._0_2_ = uVar49;
  local_c0._4_2_ = uVar49;
  local_c0._6_2_ = uVar49;
  local_c0._8_2_ = uVar49;
  local_c0._10_2_ = uVar49;
  local_c0._12_2_ = uVar49;
  local_c0._14_2_ = uVar49;
  local_c0._16_2_ = uVar49;
  local_c0._18_2_ = uVar49;
  local_c0._20_2_ = uVar49;
  local_c0._22_2_ = uVar49;
  local_c0._24_2_ = uVar49;
  local_c0._26_2_ = uVar49;
  local_c0._28_2_ = uVar49;
  local_c0._30_2_ = uVar49;
  auVar50 = vpcmpeqd_avx2(ZEXT432((uint)_s1Len),ZEXT432((uint)_s1Len));
  uVar49 = (undefined2)s2Len;
  local_e0._2_2_ = uVar49;
  local_e0._0_2_ = uVar49;
  local_e0._4_2_ = uVar49;
  local_e0._6_2_ = uVar49;
  local_e0._8_2_ = uVar49;
  local_e0._10_2_ = uVar49;
  local_e0._12_2_ = uVar49;
  local_e0._14_2_ = uVar49;
  local_e0._16_2_ = uVar49;
  local_e0._18_2_ = uVar49;
  local_e0._20_2_ = uVar49;
  local_e0._22_2_ = uVar49;
  local_e0._24_2_ = uVar49;
  local_e0._26_2_ = uVar49;
  local_e0._28_2_ = uVar49;
  local_e0._30_2_ = uVar49;
  local_1e0 = sVar30;
  sStack_1de = sVar30;
  sStack_1dc = sVar30;
  sStack_1da = sVar30;
  sStack_1d8 = sVar30;
  sStack_1d6 = sVar30;
  sStack_1d4 = sVar30;
  sStack_1d2 = sVar30;
  sStack_1d0 = sVar30;
  sStack_1ce = sVar30;
  sStack_1cc = sVar30;
  sStack_1ca = sVar30;
  sStack_1c8 = sVar30;
  sStack_1c6 = sVar30;
  sStack_1c4 = sVar30;
  sStack_1c2 = sVar30;
  local_100 = (undefined2)open;
  uStack_fe = local_100;
  uStack_fc = local_100;
  uStack_fa = local_100;
  uStack_f8 = local_100;
  uStack_f6 = local_100;
  uStack_f4 = local_100;
  uStack_f2 = local_100;
  uStack_f0 = local_100;
  uStack_ee = local_100;
  uStack_ec = local_100;
  uStack_ea = local_100;
  uStack_e8 = local_100;
  uStack_e6 = local_100;
  uStack_e4 = local_100;
  uStack_e2 = local_100;
  local_120 = (short)gap;
  sStack_11e = local_120;
  sStack_11c = local_120;
  sStack_11a = local_120;
  sStack_118 = local_120;
  sStack_116 = local_120;
  sStack_114 = local_120;
  sStack_112 = local_120;
  sStack_110 = local_120;
  sStack_10e = local_120;
  sStack_10c = local_120;
  sStack_10a = local_120;
  sStack_108 = local_120;
  sStack_106 = local_120;
  sStack_104 = local_120;
  sStack_102 = local_120;
  local_160 = vpaddsw_avx2(local_c0,auVar50);
  local_140 = vpaddsw_avx2(local_e0,auVar50);
  piVar3 = matrix->mapper;
  for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
    ptr[uVar28 + 0xf] = (int16_t)piVar3[(byte)_s2[uVar28]];
  }
  for (lVar23 = 0; lVar23 != 0xf; lVar23 = lVar23 + 1) {
    ptr[lVar23] = 0;
  }
  piVar24 = ptr + uVar44 + 0xf;
  for (uVar28 = uVar44; (int)uVar28 < (int)uVar29; uVar28 = (ulong)((int)uVar28 + 1)) {
    *piVar24 = 0;
    piVar24 = piVar24 + 1;
  }
  uVar28 = 0;
  if (s2_beg == 0) {
    for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
      ptr_00[uVar28 + 0xf] = (int16_t)iVar31;
      iVar31 = iVar31 - gap;
      ptr_01[uVar28 + 0xf] = iVar48;
    }
  }
  else {
    for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
      ptr_00[uVar28 + 0xf] = 0;
      ptr_01[uVar28 + 0xf] = iVar48;
    }
  }
  for (lVar23 = 0; uVar28 = uVar44, lVar23 != 0xf; lVar23 = lVar23 + 1) {
    ptr_00[lVar23] = iVar48;
    ptr_01[lVar23] = iVar48;
  }
  for (; (int)uVar28 < (int)uVar29; uVar28 = uVar28 + 1) {
    ptr_00[uVar28 + 0xf] = iVar48;
    ptr_01[uVar28 + 0xf] = iVar48;
  }
  ptr_00[0xe] = 0;
  uVar16 = _s1Len - 1;
  local_260._2_2_ = iVar48;
  local_260._0_2_ = iVar48;
  local_260._4_2_ = iVar48;
  local_260._6_2_ = iVar48;
  local_260._8_2_ = iVar48;
  local_260._10_2_ = iVar48;
  local_260._12_2_ = iVar48;
  local_260._14_2_ = iVar48;
  local_260._16_2_ = iVar48;
  local_260._18_2_ = iVar48;
  local_260._20_2_ = iVar48;
  local_260._22_2_ = iVar48;
  local_260._24_2_ = iVar48;
  local_260._26_2_ = iVar48;
  local_260._28_2_ = iVar48;
  local_260._30_2_ = iVar48;
  local_180 = vpalignr_avx2(ZEXT1632(local_260._16_16_),local_260,2);
  auVar71 = ZEXT3264(local_200);
  auVar70 = ZEXT3264(local_220);
  lVar23 = uVar44 * 4;
  local_380._8_8_ = 0x80009000a000b;
  local_380._0_8_ = 0xc000d000e000f;
  local_380._16_8_ = 0x4000500060007;
  local_380._24_8_ = 0x100020003;
  local_410 = 0;
  uVar28 = 0;
  auVar73 = ZEXT3264(local_260);
  auVar72 = ZEXT3264(local_260);
  auVar74 = ZEXT3264(local_260);
  local_280._2_2_ = sVar30;
  local_280._0_2_ = sVar30;
  local_280._4_2_ = sVar30;
  local_280._6_2_ = sVar30;
  local_280._10_2_ = sVar30;
  local_280._8_2_ = sVar30;
  local_280._12_2_ = sVar30;
  local_280._14_2_ = sVar30;
  local_280._18_2_ = sVar30;
  local_280._16_2_ = sVar30;
  local_280._20_2_ = sVar30;
  local_280._22_2_ = sVar30;
  local_280._26_2_ = sVar30;
  local_280._24_2_ = sVar30;
  local_280._28_2_ = sVar30;
  local_280._30_2_ = sVar30;
  while ((long)uVar28 < lVar45) {
    uVar42 = (uint)uVar28;
    if (matrix->type == 0) {
      uVar42 = (uint)local_450[uVar28];
      uVar47 = (uint)local_450[uVar28 + 1];
      uVar17 = (uint)local_450[uVar28 + 2];
      uVar39 = (uint)local_450[uVar28 + 3];
      uVar18 = (uint)local_450[uVar28 + 4];
      uVar19 = (uint)local_450[uVar28 + 5];
      uVar20 = (uint)local_450[uVar28 + 6];
      uVar43 = (uint)local_450[uVar28 + 7];
      uVar21 = (uint)local_450[uVar28 + 8];
      uVar22 = (uint)local_450[uVar28 + 9];
      uVar26 = (uint)local_450[uVar28 + 10];
      uVar27 = (uint)local_450[uVar28 + 0xb];
      uVar32 = (uint)local_450[uVar28 + 0xc];
      uVar33 = (uint)local_450[uVar28 + 0xd];
      uVar37 = (uint)local_450[uVar28 + 0xe];
      uVar13 = (int)local_450[uVar28 + 0xf];
    }
    else {
      uVar47 = uVar16;
      if ((long)(uVar28 | 1) < lVar45) {
        uVar47 = uVar42 | 1;
      }
      uVar17 = uVar42 | 2;
      if (lVar45 <= (long)(uVar28 | 2)) {
        uVar17 = uVar16;
      }
      uVar39 = uVar42 | 3;
      if (lVar45 <= (long)(uVar28 | 3)) {
        uVar39 = uVar16;
      }
      uVar18 = uVar42 | 4;
      if (lVar45 <= (long)(uVar28 | 4)) {
        uVar18 = uVar16;
      }
      uVar19 = uVar42 | 5;
      if (lVar45 <= (long)(uVar28 | 5)) {
        uVar19 = uVar16;
      }
      uVar20 = uVar42 | 6;
      if (lVar45 <= (long)(uVar28 | 6)) {
        uVar20 = uVar16;
      }
      uVar43 = uVar42 | 7;
      if (lVar45 <= (long)(uVar28 | 7)) {
        uVar43 = uVar16;
      }
      uVar21 = uVar42 | 8;
      if (lVar45 <= (long)(uVar28 | 8)) {
        uVar21 = uVar16;
      }
      uVar22 = uVar42 | 9;
      if (lVar45 <= (long)(uVar28 | 9)) {
        uVar22 = uVar16;
      }
      uVar26 = uVar42 | 10;
      if (lVar45 <= (long)(uVar28 | 10)) {
        uVar26 = uVar16;
      }
      uVar27 = uVar42 | 0xb;
      if (lVar45 <= (long)(uVar28 | 0xb)) {
        uVar27 = uVar16;
      }
      uVar32 = uVar42 | 0xc;
      if (lVar45 <= (long)(uVar28 | 0xc)) {
        uVar32 = uVar16;
      }
      uVar33 = uVar42 | 0xd;
      if (lVar45 <= (long)(uVar28 | 0xd)) {
        uVar33 = uVar16;
      }
      uVar37 = uVar42 | 0xe;
      if (lVar45 <= (long)(uVar28 | 0xe)) {
        uVar37 = uVar16;
      }
      uVar13 = uVar42 | 0xf;
      if (lVar45 <= (long)(uVar28 | 0xf)) {
        uVar13 = uVar16;
      }
    }
    local_390 = uVar28 | 1;
    local_398 = uVar28 | 0xb;
    local_3a0 = uVar28 | 0xf;
    local_3a8 = uVar28 | 0xc;
    local_3b0 = uVar28 | 0xd;
    local_3b8 = uVar28 | 0xe;
    local_3c0 = uVar28 | 6;
    local_3c8 = uVar28 | 7;
    local_3d0 = uVar28 | 8;
    local_3d8 = uVar28 | 9;
    local_3e0 = uVar28 | 10;
    local_458 = uVar28 | 3;
    local_460 = uVar28 | 4;
    local_4a0 = uVar28 | 2;
    local_4a8 = uVar28 | 5;
    iVar41 = matrix->size;
    sVar46 = auVar61._0_2_ - (short)uVar28 * local_120;
    piVar3 = matrix->matrix;
    if (s1_beg != 0) {
      sVar46 = 0;
    }
    uVar28 = uVar28 + 0x10;
    iVar1 = ptr_00[0xe];
    auVar62._2_2_ = iVar1;
    auVar62._0_2_ = iVar1;
    auVar62._4_2_ = iVar1;
    auVar62._6_2_ = iVar1;
    auVar62._8_2_ = iVar1;
    auVar62._10_2_ = iVar1;
    auVar62._12_2_ = iVar1;
    auVar62._14_2_ = iVar1;
    auVar62._16_2_ = iVar1;
    auVar62._18_2_ = iVar1;
    auVar62._20_2_ = iVar1;
    auVar62._22_2_ = iVar1;
    auVar62._24_2_ = iVar1;
    auVar62._26_2_ = iVar1;
    auVar62._28_2_ = iVar1;
    auVar62._30_2_ = iVar1;
    ptr_00[0xe] = auVar61._0_2_ - (short)uVar28 * local_120;
    auVar50 = vpblendw_avx2(local_180,auVar62,0x80);
    auVar53 = vpblendd_avx2(local_180,auVar50,0xf0);
    auVar54._2_2_ = sVar46;
    auVar54._0_2_ = sVar46;
    auVar54._4_2_ = sVar46;
    auVar54._6_2_ = sVar46;
    auVar54._8_2_ = sVar46;
    auVar54._10_2_ = sVar46;
    auVar54._12_2_ = sVar46;
    auVar54._14_2_ = sVar46;
    auVar54._16_2_ = sVar46;
    auVar54._18_2_ = sVar46;
    auVar54._20_2_ = sVar46;
    auVar54._22_2_ = sVar46;
    auVar54._24_2_ = sVar46;
    auVar54._26_2_ = sVar46;
    auVar54._28_2_ = sVar46;
    auVar54._30_2_ = sVar46;
    auVar50 = vpblendw_avx2(local_180,auVar54,0x80);
    auVar51 = vpblendd_avx2(local_180,auVar50,0xf0);
    local_a0 = vpcmpeqw_avx2(local_380,local_160);
    auVar50 = vpmovsxbw_avx2(_DAT_008a5c84);
    auVar6._2_2_ = iVar48;
    auVar6._0_2_ = iVar48;
    auVar6._4_2_ = iVar48;
    auVar6._6_2_ = iVar48;
    auVar6._8_2_ = iVar48;
    auVar6._10_2_ = iVar48;
    auVar6._12_2_ = iVar48;
    auVar6._14_2_ = iVar48;
    auVar6._16_2_ = iVar48;
    auVar6._18_2_ = iVar48;
    auVar6._20_2_ = iVar48;
    auVar6._22_2_ = iVar48;
    auVar6._24_2_ = iVar48;
    auVar6._26_2_ = iVar48;
    auVar6._28_2_ = iVar48;
    auVar6._30_2_ = iVar48;
    auVar52 = auVar6;
    for (uVar38 = 0; (~((int)uVar29 >> 0x1f) & uVar29) != uVar38; uVar38 = uVar38 + 1) {
      auVar66 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar43 * iVar41) +
                                                 (long)ptr[uVar38 + 8]]),
                            (uint)*(ushort *)
                                   (piVar3 + (long)(int)(uVar20 * iVar41) + (long)ptr[uVar38 + 9]),1
                           );
      auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar19 * iVar41) +
                                                     (long)ptr[uVar38 + 10]),2);
      auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar18 * iVar41) +
                                                     (long)ptr[uVar38 + 0xb]),3);
      auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar39 * iVar41) +
                                                     (long)ptr[uVar38 + 0xc]),4);
      auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar17 * iVar41) +
                                                     (long)ptr[uVar38 + 0xd]),5);
      auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar47 * iVar41) +
                                                     (long)ptr[uVar38 + 0xe]),6);
      auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar42 * iVar41) +
                                                     (long)ptr[uVar38 + 0xf]),7);
      auVar67 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar13 * iVar41) + (long)ptr[uVar38]]),
                            (uint)*(ushort *)
                                   (piVar3 + (long)(int)(uVar37 * iVar41) + (long)ptr[uVar38 + 1]),1
                           );
      auVar67 = vpinsrw_avx(auVar67,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar33 * iVar41) +
                                                     (long)ptr[uVar38 + 2]),2);
      auVar67 = vpinsrw_avx(auVar67,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar32 * iVar41) +
                                                     (long)ptr[uVar38 + 3]),3);
      auVar67 = vpinsrw_avx(auVar67,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar27 * iVar41) +
                                                     (long)ptr[uVar38 + 4]),4);
      auVar67 = vpinsrw_avx(auVar67,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar26 * iVar41) +
                                                     (long)ptr[uVar38 + 5]),5);
      auVar67 = vpinsrw_avx(auVar67,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar22 * iVar41) +
                                                     (long)ptr[uVar38 + 6]),6);
      auVar67 = vpinsrw_avx(auVar67,(uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar21 * iVar41) +
                                                     (long)ptr[uVar38 + 7]),7);
      iVar1 = ptr_00[uVar38 + 0xf];
      auVar65._2_2_ = iVar1;
      auVar65._0_2_ = iVar1;
      auVar65._4_2_ = iVar1;
      auVar65._6_2_ = iVar1;
      auVar65._8_2_ = iVar1;
      auVar65._10_2_ = iVar1;
      auVar65._12_2_ = iVar1;
      auVar65._14_2_ = iVar1;
      auVar65._16_2_ = iVar1;
      auVar65._18_2_ = iVar1;
      auVar65._20_2_ = iVar1;
      auVar65._22_2_ = iVar1;
      auVar65._24_2_ = iVar1;
      auVar65._26_2_ = iVar1;
      auVar65._28_2_ = iVar1;
      auVar65._30_2_ = iVar1;
      auVar68 = vpalignr_avx2(ZEXT1632(auVar51._16_16_),auVar51,2);
      auVar56 = vpblendw_avx2(auVar68,auVar65,0x80);
      auVar57 = vpblendd_avx2(auVar68,auVar56,0xf0);
      auVar52 = vpalignr_avx2(ZEXT1632(auVar52._16_16_),auVar52,2);
      iVar1 = ptr_01[uVar38 + 0xf];
      auVar69._2_2_ = iVar1;
      auVar69._0_2_ = iVar1;
      auVar69._4_2_ = iVar1;
      auVar69._6_2_ = iVar1;
      auVar69._8_2_ = iVar1;
      auVar69._10_2_ = iVar1;
      auVar69._12_2_ = iVar1;
      auVar69._14_2_ = iVar1;
      auVar69._16_2_ = iVar1;
      auVar69._18_2_ = iVar1;
      auVar69._20_2_ = iVar1;
      auVar69._22_2_ = iVar1;
      auVar69._24_2_ = iVar1;
      auVar69._26_2_ = iVar1;
      auVar69._28_2_ = iVar1;
      auVar69._30_2_ = iVar1;
      auVar68 = vpblendw_avx2(auVar52,auVar69,0x80);
      auVar68 = vpblendd_avx2(auVar52,auVar68,0xf0);
      auVar12._2_2_ = local_100;
      auVar12._0_2_ = local_100;
      auVar12._4_2_ = local_100;
      auVar12._6_2_ = local_100;
      auVar12._8_2_ = local_100;
      auVar12._10_2_ = local_100;
      auVar12._12_2_ = local_100;
      auVar12._14_2_ = local_100;
      auVar12._16_2_ = local_100;
      auVar12._18_2_ = local_100;
      auVar12._20_2_ = local_100;
      auVar12._22_2_ = local_100;
      auVar12._24_2_ = local_100;
      auVar12._26_2_ = local_100;
      auVar12._28_2_ = local_100;
      auVar12._30_2_ = local_100;
      auVar52 = vpsubsw_avx2(auVar57,auVar12);
      auVar11._2_2_ = local_120;
      auVar11._0_2_ = local_120;
      auVar11._4_2_ = local_120;
      auVar11._6_2_ = local_120;
      auVar11._8_2_ = local_120;
      auVar11._10_2_ = local_120;
      auVar11._12_2_ = local_120;
      auVar11._14_2_ = local_120;
      auVar11._16_2_ = local_120;
      auVar11._18_2_ = local_120;
      auVar11._20_2_ = local_120;
      auVar11._22_2_ = local_120;
      auVar11._24_2_ = local_120;
      auVar11._26_2_ = local_120;
      auVar11._28_2_ = local_120;
      auVar11._30_2_ = local_120;
      auVar68 = vpsubsw_avx2(auVar68,auVar11);
      auVar52 = vpmaxsw_avx2(auVar52,auVar68);
      auVar51 = vpsubsw_avx2(auVar51,auVar12);
      auVar68 = vpsubsw_avx2(auVar6,auVar11);
      auVar68 = vpmaxsw_avx2(auVar51,auVar68);
      auVar64._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar67;
      auVar64._16_16_ = ZEXT116(1) * auVar66;
      auVar51 = vpaddsw_avx2(auVar53,auVar64);
      auVar53 = vpmaxsw_avx2(auVar52,auVar68);
      auVar56 = vpmaxsw_avx2(auVar51,auVar53);
      auVar53 = vpcmpeqw_avx2(auVar50,_DAT_008a5a80);
      auVar51 = vpblendvb_avx2(auVar56,local_2a0,auVar53);
      if (0xf < uVar38) {
        local_280 = vpminsw_avx2(local_280,auVar51);
        local_260 = vpmaxsw_avx2(local_260,auVar51);
      }
      piVar4 = ((ppVar15->field_4).rowcols)->score_row;
      auVar66 = auVar51._0_16_;
      auVar67 = auVar51._16_16_;
      if (uVar38 < uVar44) {
        uVar34 = vpextrw_avx(auVar67,7);
        *(int *)((long)piVar4 + uVar38 * 4 + local_410) = (int)(short)uVar34;
      }
      if (uVar38 - 1 < uVar44 && (long)local_390 < lVar45) {
        uVar34 = vpextrw_avx(auVar67,6);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_390 + -4) = (int)(short)uVar34;
      }
      if (((long)local_4a0 < lVar45) && ((long)(uVar38 - 2) < (long)uVar44 && 1 < uVar38)) {
        uVar34 = vpextrw_avx(auVar67,5);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_4a0 + -8) = (int)(short)uVar34;
      }
      if (((long)local_458 < lVar45) && ((long)(uVar38 - 3) < (long)uVar44 && 2 < uVar38)) {
        uVar34 = vpextrw_avx(auVar67,4);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_458 + -0xc) = (int)(short)uVar34;
      }
      if (((long)local_460 < lVar45) && ((long)(uVar38 - 4) < (long)uVar44 && 3 < uVar38)) {
        uVar34 = vpextrw_avx(auVar67,3);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_460 + -0x10) = (int)(short)uVar34;
      }
      if (((long)local_4a8 < lVar45) && ((long)(uVar38 - 5) < (long)uVar44 && 4 < uVar38)) {
        uVar34 = vpextrw_avx(auVar67,2);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_4a8 + -0x14) = (int)(short)uVar34;
      }
      if (((long)local_3c0 < lVar45) && ((long)(uVar38 - 6) < (long)uVar44 && 5 < uVar38)) {
        uVar34 = vpextrw_avx(auVar67,1);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3c0 + -0x18) = (int)(short)uVar34;
      }
      if (((long)local_3c8 < lVar45) && ((long)(uVar38 - 7) < (long)uVar44 && 6 < uVar38)) {
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3c8 + -0x1c) = (int)auVar51._16_2_;
      }
      if (((long)local_3d0 < lVar45) && ((long)(uVar38 - 8) < (long)uVar44 && 7 < uVar38)) {
        uVar34 = vpextrw_avx(auVar66,7);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3d0 + -0x20) = (int)(short)uVar34;
      }
      if (((long)local_3d8 < lVar45) && ((long)(uVar38 - 9) < (long)uVar44 && 8 < uVar38)) {
        uVar34 = vpextrw_avx(auVar66,6);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3d8 + -0x24) = (int)(short)uVar34;
      }
      if (((long)local_3e0 < lVar45) && ((long)(uVar38 - 10) < (long)uVar44 && 9 < uVar38)) {
        uVar34 = vpextrw_avx(auVar66,5);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3e0 + -0x28) = (int)(short)uVar34;
      }
      if (((long)local_398 < lVar45) && ((long)(uVar38 - 0xb) < (long)uVar44 && 10 < uVar38)) {
        uVar34 = vpextrw_avx(auVar66,4);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_398 + -0x2c) = (int)(short)uVar34;
      }
      if (((long)local_3a8 < lVar45) && ((long)(uVar38 - 0xc) < (long)uVar44 && 0xb < uVar38)) {
        uVar34 = vpextrw_avx(auVar66,3);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3a8 + -0x30) = (int)(short)uVar34;
      }
      if (((long)local_3b0 < lVar45) && ((long)(uVar38 - 0xd) < (long)uVar44 && 0xc < uVar38)) {
        uVar34 = vpextrw_avx(auVar66,2);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3b0 + -0x34) = (int)(short)uVar34;
      }
      if (((long)local_3b8 < lVar45) && ((long)(uVar38 - 0xe) < (long)uVar44 && 0xd < uVar38)) {
        uVar34 = vpextrw_avx(auVar66,1);
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3b8 + -0x38) = (int)(short)uVar34;
      }
      auVar7._2_2_ = iVar48;
      auVar7._0_2_ = iVar48;
      auVar7._4_2_ = iVar48;
      auVar7._6_2_ = iVar48;
      auVar7._8_2_ = iVar48;
      auVar7._10_2_ = iVar48;
      auVar7._12_2_ = iVar48;
      auVar7._14_2_ = iVar48;
      auVar7._16_2_ = iVar48;
      auVar7._18_2_ = iVar48;
      auVar7._20_2_ = iVar48;
      auVar7._22_2_ = iVar48;
      auVar7._24_2_ = iVar48;
      auVar7._26_2_ = iVar48;
      auVar7._28_2_ = iVar48;
      auVar7._30_2_ = iVar48;
      auVar52 = vpblendvb_avx2(auVar52,auVar7,auVar53);
      if (0xe < uVar38 && (long)local_3a0 < lVar45) {
        *(int *)((long)piVar4 + uVar38 * 4 + lVar23 * local_3a0 + -0x3c) = (int)auVar51._0_2_;
      }
      auVar8._2_2_ = iVar48;
      auVar8._0_2_ = iVar48;
      auVar8._4_2_ = iVar48;
      auVar8._6_2_ = iVar48;
      auVar8._8_2_ = iVar48;
      auVar8._10_2_ = iVar48;
      auVar8._12_2_ = iVar48;
      auVar8._14_2_ = iVar48;
      auVar8._16_2_ = iVar48;
      auVar8._18_2_ = iVar48;
      auVar8._20_2_ = iVar48;
      auVar8._22_2_ = iVar48;
      auVar8._24_2_ = iVar48;
      auVar8._26_2_ = iVar48;
      auVar8._28_2_ = iVar48;
      auVar8._30_2_ = iVar48;
      auVar6 = vpblendvb_avx2(auVar68,auVar8,auVar53);
      auVar59 = vpcmpgtw_avx2(local_c0,local_380);
      auVar53 = vpcmpgtw_avx2(local_e0,auVar50);
      auVar68 = vpsraw_avx2(auVar50,0xf);
      auVar53 = vpandn_avx2(auVar68,auVar53);
      auVar68 = vpcmpgtw_avx2(auVar51,auVar71._0_32_);
      auVar53 = vpand_avx2(local_a0,auVar53);
      auVar53 = vpand_avx2(auVar53,auVar68);
      auVar58 = vpcmpeqw_avx2(auVar50,local_140);
      auVar68 = vpblendvb_avx2(auVar71._0_32_,auVar56,auVar53);
      auVar71 = ZEXT3264(auVar68);
      auVar56 = vpcmpgtw_avx2(auVar51,auVar70._0_32_);
      auVar68 = vpand_avx2(auVar59,auVar58);
      auVar68 = vpand_avx2(auVar68,auVar56);
      auVar56 = vpand_avx2(local_a0,auVar58);
      auVar56 = vpblendvb_avx2(auVar74._0_32_,auVar51,auVar56);
      auVar74 = ZEXT3264(auVar56);
      auVar56 = vpblendvb_avx2(auVar70._0_32_,auVar51,auVar68);
      auVar70 = ZEXT3264(auVar56);
      auVar68 = vpblendvb_avx2(auVar72._0_32_,local_380,auVar68);
      auVar72 = ZEXT3264(auVar68);
      auVar63._8_2_ = 1;
      auVar63._0_8_ = 0x1000100010001;
      auVar63._10_2_ = 1;
      auVar63._12_2_ = 1;
      auVar63._14_2_ = 1;
      auVar63._16_2_ = 1;
      auVar63._18_2_ = 1;
      auVar63._20_2_ = 1;
      auVar63._22_2_ = 1;
      auVar63._24_2_ = 1;
      auVar63._26_2_ = 1;
      auVar63._28_2_ = 1;
      auVar63._30_2_ = 1;
      auVar53 = vpblendvb_avx2(auVar73._0_32_,auVar50,auVar53);
      auVar73 = ZEXT3264(auVar53);
      auVar50 = vpaddsw_avx2(auVar50,auVar63);
      ptr_00[uVar38] = auVar51._0_2_;
      vpextrw_avx(auVar52._0_16_,0);
      auVar53 = auVar57;
    }
    auVar55._8_2_ = 0x10;
    auVar55._0_8_ = 0x10001000100010;
    auVar55._10_2_ = 0x10;
    auVar55._12_2_ = 0x10;
    auVar55._14_2_ = 0x10;
    auVar55._16_2_ = 0x10;
    auVar55._18_2_ = 0x10;
    auVar55._20_2_ = 0x10;
    auVar55._22_2_ = 0x10;
    auVar55._24_2_ = 0x10;
    auVar55._26_2_ = 0x10;
    auVar55._28_2_ = 0x10;
    auVar55._30_2_ = 0x10;
    local_380 = vpaddsw_avx2(local_380,auVar55);
    local_2a0 = vpsubsw_avx2(local_2a0,local_1c0);
    local_410 = local_410 + uVar44 * 0x40;
  }
  local_200 = auVar71._0_32_;
  local_220 = auVar70._0_32_;
  local_1a0 = auVar74._0_32_;
  local_240 = auVar72._0_32_;
  local_80[0] = auVar73._0_32_;
  lVar45 = 0;
  iVar41 = 0;
  uVar29 = 0;
  uVar42 = uVar35;
  uVar17 = uVar35;
  while( true ) {
    uVar14 = (ushort)uVar42;
    uVar40 = (ushort)uVar35;
    if ((int)lVar45 == 0x10) break;
    uVar2 = *(ushort *)(local_220 + lVar45 * 2);
    if ((short)uVar14 < (short)uVar2) {
      uVar29 = (int)*(short *)(local_240 + lVar45 * 2);
      uVar42 = (uint)uVar2;
    }
    else if (uVar2 == uVar14) {
      uVar19 = (uint)*(short *)(local_240 + lVar45 * 2);
      uVar18 = uVar29;
      if ((int)uVar19 <= (int)uVar29) {
        uVar18 = uVar19;
      }
      bVar5 = (int)uVar19 < (int)uVar29;
      uVar29 = uVar18;
      if (bVar5) {
        uVar42 = (uint)uVar2;
      }
    }
    if ((short)uVar40 < (short)*(ushort *)(local_200 + lVar45 * 2)) {
      iVar41 = (int)*(short *)(local_80[0] + lVar45 * 2);
      uVar35 = (uint)*(ushort *)(local_200 + lVar45 * 2);
    }
    uVar18 = (uint)*(ushort *)(local_1a0 + lVar45 * 2);
    if ((short)*(ushort *)(local_1a0 + lVar45 * 2) <= (short)(ushort)uVar17) {
      uVar18 = uVar17;
    }
    uVar17 = uVar18;
    lVar45 = lVar45 + 1;
  }
  iVar36 = iVar41;
  uVar2 = uVar40;
  if (s1_end == 0 || s2_end == 0) {
    iVar31 = s2Len + -1;
    if (s1_end != 0) goto LAB_0075b84e;
    iVar36 = iVar31;
    uVar2 = (ushort)uVar17;
    if (s2_end != 0) {
      iVar36 = iVar41;
      uVar2 = uVar40;
    }
  }
  else {
    if ((short)uVar40 < (short)uVar14) {
      iVar31 = s2Len + -1;
      goto LAB_0075b84e;
    }
    if ((uVar14 == uVar40) && (iVar31 = s2Len + -1, iVar41 == iVar31)) goto LAB_0075b84e;
  }
  uVar14 = uVar2;
  iVar31 = iVar36;
  uVar29 = uVar16;
LAB_0075b84e:
  auVar9._2_2_ = iVar48;
  auVar9._0_2_ = iVar48;
  auVar9._4_2_ = iVar48;
  auVar9._6_2_ = iVar48;
  auVar9._8_2_ = iVar48;
  auVar9._10_2_ = iVar48;
  auVar9._12_2_ = iVar48;
  auVar9._14_2_ = iVar48;
  auVar9._16_2_ = iVar48;
  auVar9._18_2_ = iVar48;
  auVar9._20_2_ = iVar48;
  auVar9._22_2_ = iVar48;
  auVar9._24_2_ = iVar48;
  auVar9._26_2_ = iVar48;
  auVar9._28_2_ = iVar48;
  auVar9._30_2_ = iVar48;
  auVar61 = vpcmpgtw_avx2(auVar9,local_280);
  auVar10._2_2_ = sVar30;
  auVar10._0_2_ = sVar30;
  auVar10._4_2_ = sVar30;
  auVar10._6_2_ = sVar30;
  auVar10._8_2_ = sVar30;
  auVar10._10_2_ = sVar30;
  auVar10._12_2_ = sVar30;
  auVar10._14_2_ = sVar30;
  auVar10._16_2_ = sVar30;
  auVar10._18_2_ = sVar30;
  auVar10._20_2_ = sVar30;
  auVar10._22_2_ = sVar30;
  auVar10._24_2_ = sVar30;
  auVar10._26_2_ = sVar30;
  auVar10._28_2_ = sVar30;
  auVar10._30_2_ = sVar30;
  auVar50 = vpcmpgtw_avx2(local_260,auVar10);
  auVar61 = vpor_avx2(auVar61,auVar50);
  if ((((((((((((((((((((((((((((((((auVar61 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   || (auVar61 >> 0xf & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                  (auVar61 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar61 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar61 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar61 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar61 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar61 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar61 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar61 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar61 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar61 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar61 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar61 >> 0x7f,0) != '\0') ||
                    (auVar61 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar61 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar61 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar61 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar61 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar61 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar61 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar61 >> 0xbf,0) != '\0') ||
            (auVar61 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar61 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar61 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         (auVar61 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
        (auVar61 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
       (auVar61 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
      (auVar61 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || auVar61[0x1f] < '\0') {
    *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
    uVar14 = 0;
    iVar31 = 0;
    uVar29 = 0;
  }
  ppVar15->score = (int)(short)uVar14;
  ppVar15->end_query = uVar29;
  ppVar15->end_ref = iVar31;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_450);
    return ppVar15;
  }
  return ppVar15;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxHRow;
    __m256i vMaxHCol;
    __m256i vLastVal;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vGapN = s1_beg ? _mm256_set1_epi16(0) : _mm256_set1_epi16(gap*N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vILimit1 = _mm256_subs_epi16(vILimit, vOne);
    vJLimit = _mm256_set1_epi16(s2Len);
    vJLimit1 = _mm256_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm256_set1_epi16(0) : _mm256_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        __m256i vIeqLimit1 = _mm256_cmpeq_epi16(vI, vILimit1);
        vNH = _mm256_srli_si256_rpl(vNH, 2);
        vNH = _mm256_insert_epi16_rpl(vNH, H_pr[-1], 15);
        vWH = _mm256_srli_si256_rpl(vWH, 2);
        vWH = _mm256_insert_epi16_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m256i vJeqLimit1 = _mm256_cmpeq_epi16(vJ, vJLimit1);
                __m256i vJgtNegOne = _mm256_cmpgt_epi16(vJ, vNegOne);
                __m256i vJltLimit = _mm256_cmplt_epi16_rpl(vJ, vJLimit);
                __m256i cond_j = _mm256_and_si256(vIltLimit, vJeqLimit1);
                __m256i cond_i = _mm256_and_si256(vIeqLimit1,
                        _mm256_and_si256(vJgtNegOne, vJltLimit));
                __m256i cond_max_row = _mm256_cmpgt_epi16(vWH, vMaxHRow);
                __m256i cond_max_col = _mm256_cmpgt_epi16(vWH, vMaxHCol);
                __m256i cond_last_val = _mm256_and_si256(vIeqLimit1, vJeqLimit1);
                __m256i cond_all_row = _mm256_and_si256(cond_max_row, cond_i);
                __m256i cond_all_col = _mm256_and_si256(cond_max_col, cond_j);
                vMaxHRow = _mm256_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm256_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm256_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
        vIBoundary = _mm256_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}